

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

cbtVector3 orth(cbtVector3 *v)

{
  cbtVector3 *this;
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  cbtVector3 cVar9;
  cbtVector3 b;
  cbtVector3 a;
  cbtVector3 local_48;
  cbtVector3 local_38;
  cbtVector3 local_28;
  
  auVar8 = in_ZMM1._8_56_;
  auVar5 = ZEXT856(0x3f800000);
  local_38.m_floats = (cbtScalar  [4])(ZEXT816(0x3f800000) << 0x40);
  cVar9 = cbtVector3::cross(v,&local_38);
  auVar6._0_8_ = cVar9.m_floats._8_8_;
  auVar6._8_56_ = auVar8;
  auVar3._0_8_ = cVar9.m_floats._0_8_;
  auVar3._8_56_ = auVar5;
  local_28.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar3._0_16_,auVar6._0_16_);
  auVar5 = ZEXT856(0);
  local_48.m_floats[0] = 0.0;
  local_48.m_floats[1] = 1.0;
  local_48.m_floats[2] = 0.0;
  local_48.m_floats[3] = 0.0;
  cVar9 = cbtVector3::cross(v,&local_48);
  auVar7._0_8_ = cVar9.m_floats._8_8_;
  auVar7._8_56_ = auVar8;
  auVar4._0_8_ = cVar9.m_floats._0_8_;
  auVar4._8_56_ = auVar5;
  local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
  cVar1 = cbtVector3::length(&local_28);
  cVar2 = cbtVector3::length(&local_38);
  this = &local_38;
  if (cVar2 < cVar1) {
    this = &local_28;
  }
  cVar9 = cbtVector3::normalized(this);
  return (cbtVector3)cVar9.m_floats;
}

Assistant:

cbtVector3 orth(const cbtVector3 &v)
{
	cbtVector3 a = cbtCross(v, cbtVector3(0, 0, 1));
	cbtVector3 b = cbtCross(v, cbtVector3(0, 1, 0));
	if (a.length() > b.length())
	{
		return a.normalized();
	}
	else
	{
		return b.normalized();
	}
}